

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableRenderTest::init
          (BuiltinVariableRenderTest *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  RenderContext *pRVar4;
  ContextInfo *this_00;
  NotSupportedError *pNVar5;
  undefined4 extraout_var;
  float *pfVar6;
  BuiltinVariableShader *this_01;
  EVP_PKEY_CTX *ctx_00;
  int local_80;
  undefined1 local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  deUint32 local_24;
  ContextType local_20;
  Vector<float,_2> local_1c;
  Vec2 range;
  float requiredPointSize;
  BuiltinVariableRenderTest *this_local;
  
  unique0x10000344 = this;
  if (this->m_test == TEST_POINT_SIZE) {
    range.m_data[0] = 5.0;
    tcu::Vector<float,_2>::Vector(&local_1c,1.0,1.0);
    pRVar4 = Context::getRenderContext
                       ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
    local_20.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
    local_24 = (deUint32)glu::ApiType::core(4,4);
    bVar2 = glu::contextSupports(local_20,(ApiType)local_24);
    if (!bVar2) {
      this_00 = Context::getContextInfo
                          ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
      bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_geometry_point_size");
      if (!bVar2) {
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar5,"Tests require GL_EXT_geometry_point_size extension.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                   ,0xa2c);
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
    pRVar4 = Context::getRenderContext
                       ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
    iVar3 = (*pRVar4->_vptr_RenderContext[3])();
    pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x818);
    pfVar6 = tcu::Vector<float,_2>::getPtr(&local_1c);
    (*pcVar1)(0x846d,pfVar6);
    pfVar6 = tcu::Vector<float,_2>::y(&local_1c);
    if (*pfVar6 <= 5.0 && *pfVar6 != 5.0) {
      local_79 = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<float>(&local_78,range.m_data);
      std::operator+(&local_58,"Test case requires point size ",&local_78);
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_58);
      local_79 = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_01 = (BuiltinVariableShader *)operator_new(0x158);
  pRVar4 = Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  local_80 = (*pRVar4->_vptr_RenderContext[2])();
  ctx_00 = (EVP_PKEY_CTX *)&local_80;
  BuiltinVariableShader::BuiltinVariableShader(this_01,(ContextType *)ctx_00,this->m_test);
  this->m_program = this_01;
  iVar3 = GeometryShaderRenderTest::init(&this->super_GeometryShaderRenderTest,ctx_00);
  return iVar3;
}

Assistant:

void BuiltinVariableRenderTest::init (void)
{
	// Requirements
	if (m_test == BuiltinVariableShader::TEST_POINT_SIZE)
	{
		const float requiredPointSize = 5.0f;

		tcu::Vec2 range = tcu::Vec2(1.0f, 1.0f);

		if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 4)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_point_size"))
			TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_point_size extension.");

		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_POINT_SIZE_RANGE, range.getPtr());
		if (range.y() < requiredPointSize)
			throw tcu::NotSupportedError("Test case requires point size " + de::toString(requiredPointSize));
	}

	m_program = new BuiltinVariableShader(m_context.getRenderContext().getType(), m_test);

	// Shader init
	GeometryShaderRenderTest::init();
}